

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertiaNonLinearParametrization.cpp
# Opt level: O1

Matrix<double,_3,_3,_0,_3,_3> * iDynTree::diag(Matrix<double,_3,_1,_0,_3,_1> *vec)

{
  ActualDstType actualDst;
  Matrix<double,_3,_3,_0,_3,_3> *ret;
  
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [6] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [7] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [4] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [5] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [2] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [3] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [0] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [1] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [8] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [0] = (vec->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
        [0];
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [4] = (vec->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
        [1];
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [8] = (vec->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
        [2];
  return actualDst;
}

Assistant:

Eigen::Matrix<double, 3, 3> diag(const Eigen::Matrix<double, 3, 1> & vec)
{
    Eigen::Matrix<double, 3, 3> ret;

    ret.setZero();

    ret(0,0) = vec(0);
    ret(1,1) = vec(1);
    ret(2,2) = vec(2);

    return ret;
}